

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_105c52d::BlendA64MaskTestHBD_d16_DISABLED_Speed_Test::TestBody
          (BlendA64MaskTestHBD_d16_DISABLED_Speed_Test *this)

{
  uint16_t uVar1;
  int iVar2;
  BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
  *in_RDI;
  int i_1;
  int i;
  int bsize;
  int kRunTimes;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int local_18;
  int local_14;
  int local_10;
  
  for (local_10 = 0; local_10 < 0x16; local_10 = local_10 + 1) {
    *(uint32_t *)
     &in_RDI[1].
      super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int)>
      .
      super_TestWithParam<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int)>_>
      .super_Test._vptr_Test = 8;
    while ((int)*(uint32_t *)
                 &in_RDI[1].
                  super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int)>
                  .
                  super_TestWithParam<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int)>_>
                  .super_Test._vptr_Test < 0xd) {
      for (local_14 = 0; local_14 < 0x14000; local_14 = local_14 + 1) {
        uVar1 = libaom_test::ACMRandom::Rand12((ACMRandom *)in_RDI);
        in_RDI->dst_ref_[local_14] =
             (unsigned_short)
             ((long)(ulong)uVar1 %
             (long)(1 << ((byte)*(uint32_t *)
                                 &in_RDI[1].
                                  super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int)>
                                  .
                                  super_TestWithParam<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int)>_>
                                  .super_Test._vptr_Test & 0x1f)));
        uVar1 = libaom_test::ACMRandom::Rand12((ACMRandom *)in_RDI);
        in_RDI->dst_tst_[local_14] =
             (unsigned_short)
             ((long)(ulong)uVar1 %
             (long)(1 << ((byte)*(uint32_t *)
                                 &in_RDI[1].
                                  super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int)>
                                  .
                                  super_TestWithParam<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int)>_>
                                  .super_Test._vptr_Test & 0x1f)));
        uVar1 = libaom_test::ACMRandom::Rand16((ACMRandom *)in_RDI);
        in_RDI->src0_[local_14] = uVar1;
        uVar1 = libaom_test::ACMRandom::Rand16((ACMRandom *)in_RDI);
        in_RDI->src1_[local_14] = uVar1;
      }
      for (local_18 = 0; local_18 < 0x10000; local_18 = local_18 + 1) {
        iVar2 = libaom_test::ACMRandom::operator()((ACMRandom *)in_RDI,in_stack_ffffffffffffffdc);
        in_RDI->mask_[local_18] = (uint8_t)iVar2;
      }
      BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
      ::RunTest(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
      *(uint32_t *)
       &in_RDI[1].
        super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int)>
        .
        super_TestWithParam<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int)>_>
        .super_Test._vptr_Test =
           *(uint32_t *)
            &in_RDI[1].
             super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int)>
             .
             super_TestWithParam<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int)>_>
             .super_Test._vptr_Test + 2;
    }
  }
  return;
}

Assistant:

TEST_P(BlendA64MaskTestHBD_d16, DISABLED_Speed) {
  const int kRunTimes = 10000000;
  for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
    for (bit_depth_ = 8; bit_depth_ <= 12; bit_depth_ += 2) {
      for (int i = 0; i < kBufSize; ++i) {
        dst_ref_[i] = rng_.Rand12() % (1 << bit_depth_);
        dst_tst_[i] = rng_.Rand12() % (1 << bit_depth_);

        src0_[i] = rng_.Rand16();
        src1_[i] = rng_.Rand16();
      }

      for (int i = 0; i < kMaxMaskSize; ++i)
        mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

      RunTest(bsize, kRunTimes);
    }
  }
}